

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_location_handler.c
# Opt level: O1

cio_http_cb_return handle_field_value(cio_http_client *client,char *at,size_t length)

{
  byte bVar1;
  cio_http_location_handler *pcVar2;
  cio_http_cb_t p_Var3;
  cio_http_data_cb_t p_Var4;
  char *__s;
  uint uVar5;
  size_t sVar6;
  byte bVar7;
  int iVar8;
  cio_http_cb_return cVar9;
  byte *pbVar10;
  size_t sVar11;
  cio_http_data_cb_t p_Var12;
  byte *pbVar13;
  ulong uVar14;
  byte *__n;
  byte *__s2;
  bool bVar15;
  cio_http_cb_return local_64;
  
  pcVar2 = client->current_handler;
  bVar7 = *(byte *)&pcVar2[1].on_message_complete;
  cVar9 = (uint)bVar7 & 3;
  switch((uint)bVar7 & 3) {
  case CIO_HTTP_CB_SUCCESS:
    goto switchD_00106393_caseD_0;
  case CIO_HTTP_CB_SKIP_BODY:
    if (length != 0x18) {
      cVar9 = CIO_HTTP_CB_ERROR;
      goto switchD_00106393_caseD_0;
    }
    pcVar2[1].on_port = *(cio_http_data_cb_t *)(at + 0x10);
    p_Var4 = *(cio_http_data_cb_t *)(at + 8);
    pcVar2[1].on_schema = *(cio_http_data_cb_t *)at;
    pcVar2[1].on_host = p_Var4;
    pcVar2[1].on_path = (cio_http_data_cb_t)0x3541464145383532;
    pcVar2[1].on_query = (cio_http_data_cb_t)0x37342d343139452d;
    pcVar2[1].on_fragment = (cio_http_data_cb_t)0x2d414335392d4144;
    pcVar2[1].on_header_field_name = (cio_http_data_cb_t)0x3843443042413543;
    *(undefined4 *)&pcVar2[1].on_header_field_value = 0x31314235;
    break;
  case 2:
    cVar9 = CIO_HTTP_CB_ERROR;
    if ((length != 2) || (*(short *)at != 0x3331)) goto switchD_00106393_caseD_0;
    *(byte *)&pcVar2[1].on_message_complete = bVar7 | 8;
    break;
  case 3:
    *(byte *)&pcVar2[1].on_message_complete = bVar7 | 4;
    p_Var3 = pcVar2[1].on_headers_complete;
    pbVar13 = (byte *)at;
    sVar11 = length;
    if (p_Var3 != (cio_http_cb_t)0x0) {
joined_r0x00106430:
      do {
        if (length == 0) {
          at = (char *)0x0;
        }
        else if (*at != 0x2c) {
          length = length - 1;
          at = (char *)((byte *)at + 1);
          goto joined_r0x00106430;
        }
        __s2 = pbVar13;
        sVar6 = (long)at - (long)pbVar13;
        uVar14 = (long)at - (long)pbVar13;
        if ((byte *)at == (byte *)0x0) {
          sVar6 = sVar11;
          uVar14 = sVar11;
        }
        for (; sVar6 != 0; sVar6 = sVar6 - 1) {
          if ((*__s2 != 0x20) && (*__s2 != 9)) goto LAB_00106478;
          __s2 = __s2 + 1;
        }
        __s2 = (byte *)0x0;
LAB_00106478:
        bVar7 = 2;
        if (__s2 != (byte *)0x0) {
          for (__n = pbVar13 + (uVar14 - (long)__s2);
              (__s2[(long)(__n + -1)] == 0x20 || (__s2[(long)(__n + -1)] == 9)); __n = __n + -1) {
          }
          bVar15 = __n != (byte *)0x0;
          if (bVar15) {
            bVar1 = *__s2;
            if ((bVar1 & 0x7c) == 0x3c || (byte)(bVar1 + 0x81) < 0xa2) goto LAB_001065bd;
            bVar15 = true;
            pbVar10 = (byte *)0x0;
            while( true ) {
              uVar5 = (uint)bVar1;
              if ((((uVar5 - 0x22 < 0x3c) &&
                   ((0xe000000430020c1U >> ((ulong)(uVar5 - 0x22) & 0x3f) & 1) != 0)) ||
                  (uVar5 == 0x7b)) || (uVar5 == 0x7d)) break;
              bVar15 = pbVar10 + 1 < __n;
              if (((__n + -1 == pbVar10) ||
                  (bVar1 = __s2[(long)(pbVar10 + 1)], (byte)(bVar1 + 0x81) < 0xa2)) ||
                 (pbVar10 = pbVar10 + 1, (bVar1 & 0x7c) == 0x3c)) break;
            }
          }
          if (!bVar15) {
            p_Var4 = pcVar2[1].on_body;
            bVar15 = p_Var4 != (cio_http_data_cb_t)0x0;
            if (bVar15) {
              p_Var12 = (cio_http_data_cb_t)0x0;
              bVar15 = true;
              do {
                __s = *(char **)(p_Var3 + (long)p_Var12 * 8);
                pbVar10 = (byte *)strlen(__s);
                if ((pbVar10 == __n) && (iVar8 = bcmp(__s,__s2,(size_t)__n), iVar8 == 0)) {
                  *(int *)((long)&pcVar2[1].on_message_complete + 4) = (int)p_Var12;
                  break;
                }
                p_Var12 = (cio_http_data_cb_t)(ulong)((int)p_Var12 + 1);
                bVar15 = p_Var12 < p_Var4;
              } while (p_Var12 < p_Var4);
            }
            bVar7 = ~bVar15 & 1;
          }
        }
LAB_001065bd:
        bVar15 = true;
        if (bVar7 == 0) {
          local_64 = CIO_HTTP_CB_SUCCESS;
        }
        else if (bVar7 == 2) {
          local_64 = CIO_HTTP_CB_ERROR;
        }
        else {
          pbVar13 = pbVar13 + uVar14 + 1;
          sVar11 = sVar11 + ~uVar14;
          bVar15 = false;
        }
        if (((byte *)at == (byte *)0x0) || (length = sVar11, at = (char *)pbVar13, bVar15))
        goto LAB_001065f8;
      } while( true );
    }
  }
  cVar9 = CIO_HTTP_CB_SUCCESS;
  goto switchD_00106393_caseD_0;
LAB_001065f8:
  cVar9 = CIO_HTTP_CB_ERROR;
  if (bVar15) {
    cVar9 = local_64;
  }
switchD_00106393_caseD_0:
  *(byte *)&pcVar2[1].on_message_complete = *(byte *)&pcVar2[1].on_message_complete & 0xfc;
  return cVar9;
}

Assistant:

static enum cio_http_cb_return handle_field_value(struct cio_http_client *client, const char *at, size_t length)
{
	enum cio_http_cb_return ret = CIO_HTTP_CB_SUCCESS;

	struct cio_websocket_location_handler *wslh = cio_container_of(client->current_handler, struct cio_websocket_location_handler, http_location);

	uint_fast8_t header_field = (uint_fast8_t)wslh->flags.current_header_field;

	switch (header_field) {
	case CIO_WS_HEADER_SEC_WEBSOCKET_KEY:
		ret = save_websocket_key(wslh, at, length);
		break;

	case CIO_WS_HEADER_SEC_WEBSOCKET_VERSION:
		ret = check_websocket_version(wslh, at, length);
		break;

	case CIO_WS_HEADER_SEC_WEBSOCKET_PROTOCOL:
		wslh->flags.subprotocol_requested = 1;
		ret = check_websocket_protocol(wslh, at, length);
		break;

	default:
		break;
	}

	wslh->flags.current_header_field = CIO_WS_HEADER_UNKNOWN;
	return ret;
}